

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name.h
# Opt level: O1

void F_StartIntermission(FName *seq,BYTE state)

{
  Node *pNVar1;
  Node *pNVar2;
  
  pNVar1 = IntermissionDescriptors.Nodes + (IntermissionDescriptors.Size - 1 & seq->Index);
  while ((pNVar2 = pNVar1, pNVar2 != (Node *)0x0 && (pNVar2->Next != (Node *)0x1))) {
    pNVar1 = pNVar2->Next;
    if ((pNVar2->Pair).Key.Index == seq->Index) {
LAB_00302111:
      if (pNVar2 == (Node *)0x0) {
        return;
      }
      F_StartIntermission((pNVar2->Pair).Value,false,state);
      return;
    }
  }
  pNVar2 = (Node *)0x0;
  goto LAB_00302111;
}

Assistant:

FName (const FName &other) { Index = other.Index; }